

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

vector<float,_pstd::pmr::polymorphic_allocator<float>_> *
pbrt::Sample1DFunction
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          function<float_(float)> *f,int nSteps,int nSamples,Float min,Float max,Allocator alloc)

{
  ulong uVar1;
  int j;
  int iVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  float local_3c;
  polymorphic_allocator<float> local_38;
  undefined1 extraout_var [60];
  
  local_3c = 0.0;
  local_38.memoryResource = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (__return_storage_ptr__,(long)nSteps,&local_3c,&local_38);
  for (uVar1 = 0; uVar1 != (uint)(~(nSteps >> 0x1f) & nSteps); uVar1 = uVar1 + 1) {
    iVar2 = 0;
    auVar5 = ZEXT816(0);
    while (iVar2 <= nSamples) {
      fVar4 = ((float)iVar2 / (float)nSamples + (float)(int)uVar1) / (float)nSteps;
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * max)),ZEXT416((uint)(1.0 - fVar4)),
                               ZEXT416((uint)min));
      auVar6._0_4_ = std::function<float_(float)>::operator()(f,auVar3._0_4_);
      auVar6._4_60_ = extraout_var;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar3 = vandps_avx512vl(auVar6._0_16_,auVar3);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar5._0_8_;
      iVar2 = iVar2 + 1;
      auVar5._0_8_ = (double)auVar3._0_4_;
      auVar5._8_8_ = auVar3._8_8_;
      auVar5 = vmaxsd_avx(auVar5,auVar7);
    }
    __return_storage_ptr__->ptr[uVar1] = (float)auVar5._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> Sample1DFunction(std::function<Float(Float)> f, int nSteps,
                                     int nSamples, Float min, Float max,
                                     Allocator alloc) {
    pstd::vector<Float> values(nSteps, Float(0), alloc);
    for (int i = 0; i < nSteps; ++i) {
        double accum = 0;
        // One extra so that we sample at the very start and the very end.
        for (int j = 0; j < nSamples + 1; ++j) {
            Float delta = Float(j) / nSamples;
            Float v = Lerp((i + delta) / Float(nSteps), min, max);
            Float fv = std::abs(f(v));
            accum = std::max<double>(accum, fv);
        }
        // There's actually no need for the divide by nSamples, since
        // these are normalzed into a PDF anyway.
        values[i] = accum;
    }
    return values;
}